

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void getChromaticities(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  invalid_argument *this;
  allocator<char> *__a;
  float *pfVar1;
  long lVar2;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  float fVar3;
  double dVar4;
  ChromaticitiesAttribute *a;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  string local_98 [8];
  TypedAttribute<Imf_3_2::Chromaticities> *in_stack_ffffffffffffff70;
  
  if (in_ESI + -9 < *in_RCX) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Expected 8 chromaticity values");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __a = (allocator<char> *)operator_new(0x28);
  Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::TypedAttribute(in_stack_ffffffffffffff70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,__a);
  SetAttr::SetAttr((SetAttr *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                   in_stack_ffffffffffffff24,
                   (Attribute *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  std::vector<SetAttr,_std::allocator<SetAttr>_>::push_back
            ((vector<SetAttr,_std::allocator<SetAttr>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (value_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  SetAttr::~SetAttr((SetAttr *)0x10679f);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  dVar4 = strtod(*(char **)(in_RDX + (long)(*in_RCX + 1) * 8),(char **)0x0);
  fVar3 = (float)dVar4;
  pfVar1 = (float *)Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::value();
  *pfVar1 = fVar3;
  dVar4 = strtod(*(char **)(in_RDX + (long)(*in_RCX + 2) * 8),(char **)0x0);
  fVar3 = (float)dVar4;
  lVar2 = Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::value();
  *(float *)(lVar2 + 4) = fVar3;
  dVar4 = strtod(*(char **)(in_RDX + (long)(*in_RCX + 3) * 8),(char **)0x0);
  fVar3 = (float)dVar4;
  lVar2 = Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::value();
  *(float *)(lVar2 + 8) = fVar3;
  dVar4 = strtod(*(char **)(in_RDX + (long)(*in_RCX + 4) * 8),(char **)0x0);
  fVar3 = (float)dVar4;
  lVar2 = Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::value();
  *(float *)(lVar2 + 0xc) = fVar3;
  dVar4 = strtod(*(char **)(in_RDX + (long)(*in_RCX + 5) * 8),(char **)0x0);
  fVar3 = (float)dVar4;
  lVar2 = Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::value();
  *(float *)(lVar2 + 0x10) = fVar3;
  dVar4 = strtod(*(char **)(in_RDX + (long)(*in_RCX + 6) * 8),(char **)0x0);
  fVar3 = (float)dVar4;
  lVar2 = Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::value();
  *(float *)(lVar2 + 0x14) = fVar3;
  dVar4 = strtod(*(char **)(in_RDX + (long)(*in_RCX + 7) * 8),(char **)0x0);
  fVar3 = (float)dVar4;
  lVar2 = Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::value();
  *(float *)(lVar2 + 0x18) = fVar3;
  dVar4 = strtod(*(char **)(in_RDX + (long)(*in_RCX + 8) * 8),(char **)0x0);
  fVar3 = (float)dVar4;
  lVar2 = Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::value();
  *(float *)(lVar2 + 0x1c) = fVar3;
  *in_RCX = *in_RCX + 9;
  return;
}

Assistant:

void
getChromaticities (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs)
{
    if (i > argc - 9)
        throw invalid_argument("Expected 8 chromaticity values");

    ChromaticitiesAttribute* a = new ChromaticitiesAttribute;
    attrs.push_back (SetAttr (attrName, part, a));

    a->value ().red.x   = static_cast<float> (strtod (argv[i + 1], 0));
    a->value ().red.y   = static_cast<float> (strtod (argv[i + 2], 0));
    a->value ().green.x = static_cast<float> (strtod (argv[i + 3], 0));
    a->value ().green.y = static_cast<float> (strtod (argv[i + 4], 0));
    a->value ().blue.x  = static_cast<float> (strtod (argv[i + 5], 0));
    a->value ().blue.y  = static_cast<float> (strtod (argv[i + 6], 0));
    a->value ().white.x = static_cast<float> (strtod (argv[i + 7], 0));
    a->value ().white.y = static_cast<float> (strtod (argv[i + 8], 0));
    i += 9;
}